

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O2

bool anon_unknown.dwarf_54f5::remove_file_or_directory(path *p,file_type type,error_code *ec)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int errval;
  err_t error_num;
  char *pcVar4;
  
  if (type == directory_file) {
    pcVar4 = (p->m_pathname)._M_dataplus._M_p;
    iVar2 = rmdir(pcVar4);
    errval = (int)pcVar4;
  }
  else {
    if (type == file_not_found) {
      if (ec == (error_code *)0x0) {
        return false;
      }
      boost::system::error_code::clear(ec);
      return false;
    }
    pcVar4 = (p->m_pathname)._M_dataplus._M_p;
    iVar2 = unlink(pcVar4);
    errval = (int)pcVar4;
  }
  if (iVar2 == 0) {
    error_num = 0;
  }
  else {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    bVar1 = not_found_error(errval);
    error_num = 0;
    if (!bVar1) {
      error_num = iVar2;
    }
  }
  bVar1 = error(error_num,p,ec,"boost::filesystem::remove");
  if (bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool remove_file_or_directory(const path& p, fs::file_type type, error_code* ec)
    // return true if file removed, false if not removed
  {
    if (type == fs::file_not_found)
    {
      if (ec != 0) ec->clear();
      return false;
    }

    if (type == fs::directory_file
#     ifdef BOOST_WINDOWS_API
        || type == fs::_detail_directory_symlink
#     endif
      )
    {
      if (error(!remove_directory(p) ? BOOST_ERRNO : 0, p, ec,
        "boost::filesystem::remove"))
          return false;
    }
    else
    {
      if (error(!remove_file(p) ? BOOST_ERRNO : 0, p, ec,
        "boost::filesystem::remove"))
          return false;
    }
    return true;
  }